

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> * __thiscall
testing::internal::
FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::With
          (MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>
           *__return_storage_ptr__,
          FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>
          *this,Matcher<const_std::vector<char,_std::allocator<char>_>_&> *m,
          Matcher<unsigned_long> *m_1)

{
  _Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
  local_40;
  
  local_40.super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
  super_MatcherBase<unsigned_long>.vtable_ = (m_1->super_MatcherBase<unsigned_long>).vtable_;
  local_40.super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
  super_MatcherBase<unsigned_long>.buffer_ = (m_1->super_MatcherBase<unsigned_long>).buffer_;
  (m_1->super_MatcherBase<unsigned_long>).vtable_ = (VTable *)0x0;
  local_40.super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
  super_MatcherBase<unsigned_long>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002358b0;
  local_40.
  super__Head_base<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_false>.
  _M_head_impl.super_MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>.vtable_ =
       (m->super_MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>).vtable_;
  local_40.
  super__Head_base<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_false>.
  _M_head_impl.super_MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>.buffer_ =
       (m->super_MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>).buffer_;
  (m->super_MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>).vtable_ = (VTable *)0x0;
  local_40.
  super__Head_base<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_false>.
  _M_head_impl.super_MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00235810;
  __return_storage_ptr__->function_mocker_ = this;
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
  ::_Tuple_impl(&(__return_storage_ptr__->matchers_).
                 super__Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
                ,&local_40);
  MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::~MatcherBase
            ((MatcherBase<const_std::vector<char,_std::allocator<char>_>_&> *)
             &local_40.
              super__Head_base<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_false>
            );
  MatcherBase<unsigned_long>::~MatcherBase((MatcherBase<unsigned_long> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }